

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * mp_from_bytes_int(ptrlen bytes,size_t m,size_t c)

{
  size_t nw_00;
  mp_int *pmVar1;
  ulong local_40;
  size_t i;
  mp_int *n;
  size_t nw;
  size_t c_local;
  size_t m_local;
  ptrlen bytes_local;
  
  nw_00 = size_t_max(bytes.len + 7 >> 3,1);
  pmVar1 = mp_make_sized(nw_00);
  for (local_40 = 0; local_40 < bytes.len; local_40 = local_40 + 1) {
    pmVar1->w[local_40 >> 3] =
         (ulong)*(byte *)((long)bytes.ptr + m * local_40 + c) << (sbyte)((local_40 & 7) << 3) |
         pmVar1->w[local_40 >> 3];
  }
  return pmVar1;
}

Assistant:

static mp_int *mp_from_bytes_int(ptrlen bytes, size_t m, size_t c)
{
    size_t nw = (bytes.len + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES;
    nw = size_t_max(nw, 1);
    mp_int *n = mp_make_sized(nw);
    for (size_t i = 0; i < bytes.len; i++)
        n->w[i / BIGNUM_INT_BYTES] |=
            (BignumInt)(((const unsigned char *)bytes.ptr)[m*i+c]) <<
            (8 * (i % BIGNUM_INT_BYTES));
    return n;
}